

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::DrawTestBase::setup16x2Depths(DrawTestBase *this,DEPTH_RANGE_METHOD method)

{
  bool bVar1;
  RenderContext *pRVar2;
  ApiType local_24;
  ApiType *local_20;
  ContextType *context_type;
  DrawTestBase *pDStack_10;
  DEPTH_RANGE_METHOD method_local;
  DrawTestBase *this_local;
  
  context_type._4_4_ = method;
  pDStack_10 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  local_24.m_bits = (*pRVar2->_vptr_RenderContext[2])();
  local_20 = &local_24;
  bVar1 = glu::isContextTypeGLCore((ContextType)local_24.m_bits);
  if (bVar1) {
    setup16x2DepthsHelper<double>(this,context_type._4_4_,(double *)0x0);
  }
  else {
    setup16x2DepthsHelper<float>(this,context_type._4_4_,(float *)0x0);
  }
  return;
}

Assistant:

void DrawTestBase::setup16x2Depths(DEPTH_RANGE_METHOD method)
{
	const glu::ContextType& context_type = m_context.getRenderContext().getType();

	if (glu::isContextTypeGLCore(context_type))
	{
		setup16x2DepthsHelper<GLdouble>(method);
	}
	else
	{
		DE_ASSERT(glu::isContextTypeES(context_type));
		setup16x2DepthsHelper<GLfloat>(method);
	}
}